

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O0

int deCtz32(deUint32 a)

{
  undefined4 local_c;
  deUint32 a_local;
  
  if (a == 0) {
    local_c = 0x20;
  }
  else {
    local_c = 0;
    for (; (a & 1) == 0; a = a >> 1 | 0x80000000) {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

DE_INLINE int deCtz32 (deUint32 a)
{
#if (DE_COMPILER == DE_COMPILER_MSC)
	unsigned long i;
	if (_BitScanForward(&i, (unsigned long)a) == 0)
		return 32;
	else
		return i;
#elif (DE_COMPILER == DE_COMPILER_GCC) || (DE_COMPILER == DE_COMPILER_CLANG)
	if (a == 0)
		return 32;
	else
		return __builtin_ctz((unsigned int)a);
#else
	if ((a & 0x00FFFFFFu) == 0)
		return (int)g_ctzLUT[a >> 24] + 24;
	if ((a & 0x0000FFFFu) == 0)
		return (int)g_ctzLUT[(a >> 16) & 0xffu] + 16;
	if ((a & 0x000000FFu) == 0)
		return (int)g_ctzLUT[(a >> 8) & 0xffu] + 8;
	return (int)g_ctzLUT[a & 0xffu];
#endif
}